

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall
PPointer::SetPointer
          (PPointer *this,void *base,uint offset,TArray<unsigned_long,_unsigned_long> *special)

{
  bool bVar1;
  ulong local_18;
  
  if (this->PointedType != (PType *)0x0) {
    bVar1 = DObject::IsKindOf((DObject *)this->PointedType,PClass::RegistrationInfo.MyClass);
    if (bVar1) {
      local_18 = (ulong)offset;
      TArray<unsigned_long,_unsigned_long>::Push(special,&local_18);
    }
  }
  return;
}

Assistant:

void PPointer::SetPointer(void *base, unsigned offset, TArray<size_t> *special) const
{
	if (PointedType != nullptr && PointedType->IsKindOf(RUNTIME_CLASS(PClass)))
	{
		// Add to the list of pointers for this class.
		special->Push(offset);
	}
}